

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# untyped_message.cc
# Opt level: O2

Status __thiscall
google::protobuf::json_internal::UntypedMessage::Decode
          (UntypedMessage *this,CodedInputStream *stream,optional<int> current_group)

{
  byte *pbVar1;
  bool bVar2;
  uint32_t first_byte_or_zero;
  UntypedMessage *value;
  ulong in_RCX;
  uint wire_type;
  int iVar3;
  int32_t field_number;
  uint64_t x;
  undefined1 local_88 [32];
  vector<int,_std::allocator<int>_> group_stack;
  StatusOr<const_google::protobuf::json_internal::ResolverPool::Message_*> group_desc;
  
  group_stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  group_stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  group_stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
LAB_002a3f83:
  do {
    pbVar1 = *(byte **)current_group.super__Optional_base<int,_true,_true>._M_payload.
                       super__Optional_payload_base<int>;
    if (pbVar1 < *(byte **)((long)current_group.super__Optional_base<int,_true,_true>._M_payload.
                                  super__Optional_payload_base<int> + 8)) {
      first_byte_or_zero = (uint32_t)*pbVar1;
      if ((char)*pbVar1 < '\0') goto LAB_002a3fa0;
      *(byte **)current_group.super__Optional_base<int,_true,_true>._M_payload.
                super__Optional_payload_base<int> = pbVar1 + 1;
    }
    else {
      first_byte_or_zero = 0;
LAB_002a3fa0:
      first_byte_or_zero =
           io::CodedInputStream::ReadTagFallback
                     ((CodedInputStream *)
                      current_group.super__Optional_base<int,_true,_true>._M_payload.
                      super__Optional_payload_base<int>,first_byte_or_zero);
    }
    *(uint32_t *)
     ((long)current_group.super__Optional_base<int,_true,_true>._M_payload.
            super__Optional_payload_base<int> + 0x20) = first_byte_or_zero;
    if (first_byte_or_zero == 0) {
LAB_002a4280:
      this->desc_ = (Message *)0x1;
      goto LAB_002a4287;
    }
    field_number = first_byte_or_zero >> 3;
    wire_type = first_byte_or_zero & 7;
    if ((wire_type == 4) &&
       (group_stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start ==
        group_stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish)) {
      if ((in_RCX >> 0x20 & 1) == 0) {
        MakeEndGroupWithoutGroupError(0);
      }
      else {
        if (field_number == (uint)in_RCX) goto LAB_002a4280;
        MakeEndGroupMismatchError(0,0x2a42b8);
      }
      goto LAB_002a4287;
    }
    value = (UntypedMessage *)
            ResolverPool::Message::FindField((Message *)stream->buffer_,field_number);
    if (value != (UntypedMessage *)0x0 &&
        group_stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start ==
        group_stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      switch(wire_type) {
      case 0:
        DecodeVarint(this,stream,
                     (Field *)current_group.super__Optional_base<int,_true,_true>._M_payload.
                              super__Optional_payload_base<int>);
        break;
      case 1:
        Decode64Bit(this,stream,
                    (Field *)current_group.super__Optional_base<int,_true,_true>._M_payload.
                             super__Optional_payload_base<int>);
        break;
      case 2:
        DecodeDelimited(this,stream,
                        (Field *)current_group.super__Optional_base<int,_true,_true>._M_payload.
                                 super__Optional_payload_base<int>);
        break;
      case 3:
        if (*(int *)((value->fields_).super_raw_hash_map<_2385b75b_>.super_raw_hash_set<_2385b75b_>.
                     settings_.
                     super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::variant<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool,_std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<google::protobuf::json_internal::UntypedMessage,_std::allocator<google::protobuf::json_internal::UntypedMessage>_>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                     .
                     super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
                     .value.capacity_ + 0x48) != 10) {
          MakeFieldNotGroupError(0);
          goto LAB_002a4287;
        }
        ResolverPool::Field::MessageType((Field *)&group_desc);
        absl::lts_20240722::Status::Status((Status *)this,(Status *)&group_desc);
        iVar3 = 1;
        if (this->desc_ == (Message *)0x1) {
          absl::lts_20240722::Status::~Status((Status *)this);
          absl::lts_20240722::internal_statusor::
          StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>::EnsureOk
                    (&group_desc.
                      super_StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>
                    );
          x = (uint64_t)
              group_desc.
              super_StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>.
              field_1;
          local_88._0_8_ = (uint8_t *)0x0;
          local_88._8_8_ = (ZeroCopyInputStream *)0x0;
          local_88._16_8_ = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>
          ;
          Decode(this,(CodedInputStream *)&x,current_group);
          iVar3 = 1;
          if (this->desc_ == (Message *)0x1) {
            absl::lts_20240722::Status::~Status((Status *)this);
            InsertField<google::protobuf::json_internal::UntypedMessage>(this,(Field *)stream,value)
            ;
            iVar3 = 1;
            if (this->desc_ == (Message *)0x1) {
              absl::lts_20240722::Status::~Status((Status *)this);
              iVar3 = 5;
            }
          }
          absl::lts_20240722::container_internal::raw_hash_set<$2385b75b$>::~raw_hash_set
                    ((raw_hash_set<_2385b75b_> *)local_88);
        }
        absl::lts_20240722::Status::~Status((Status *)&group_desc);
        if (iVar3 != 5) goto LAB_002a425a;
        goto LAB_002a3f83;
      case 4:
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&x,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/json/internal/untyped_message.cc"
                   ,0x134);
        absl::lts_20240722::log_internal::LogMessage::operator<<
                  ((LogMessage *)&x,(char (*) [12])"unreachable");
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&x);
      case 5:
        Decode32Bit(this,stream,
                    (Field *)current_group.super__Optional_base<int,_true,_true>._M_payload.
                             super__Optional_payload_base<int>);
        break;
      default:
        goto switchD_002a4023_default;
      }
      if (this->desc_ != (Message *)0x1) goto LAB_002a4287;
      absl::lts_20240722::Status::~Status((Status *)this);
      goto LAB_002a3f83;
    }
    switch(wire_type) {
    case 0:
      bVar2 = io::CodedInputStream::ReadVarint64
                        ((CodedInputStream *)
                         current_group.super__Optional_base<int,_true,_true>._M_payload.
                         super__Optional_payload_base<int>,&x);
      iVar3 = 2;
      if (!bVar2) {
        MakeUnexpectedEofError();
        iVar3 = 1;
      }
      break;
    case 1:
      bVar2 = io::CodedInputStream::ReadLittleEndian64
                        ((CodedInputStream *)
                         current_group.super__Optional_base<int,_true,_true>._M_payload.
                         super__Optional_payload_base<int>,&x);
      iVar3 = 2;
      if (!bVar2) {
        MakeUnexpectedEofError();
        iVar3 = 1;
      }
      break;
    case 2:
      bVar2 = io::CodedInputStream::ReadVarint32
                        ((CodedInputStream *)
                         current_group.super__Optional_base<int,_true,_true>._M_payload.
                         super__Optional_payload_base<int>,(uint32_t *)&x);
      if (bVar2) {
        io::CodedInputStream::Skip
                  ((CodedInputStream *)
                   current_group.super__Optional_base<int,_true,_true>._M_payload.
                   super__Optional_payload_base<int>,(int)x);
        iVar3 = 2;
      }
      else {
        MakeUnexpectedEofError();
        iVar3 = 1;
      }
      break;
    case 3:
      std::vector<int,_std::allocator<int>_>::push_back(&group_stack,&field_number);
      goto LAB_002a3f83;
    case 4:
      if (group_stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start ==
          group_stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        MakeEndGroupWithoutGroupError(0);
        goto LAB_002a4287;
      }
      if (field_number !=
          group_stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish[-1]) {
        MakeEndGroupMismatchError(0,0x2a42d9);
        goto LAB_002a4287;
      }
      group_stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = group_stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + -1;
      goto LAB_002a3f83;
    case 5:
      bVar2 = io::CodedInputStream::ReadLittleEndian32
                        ((CodedInputStream *)
                         current_group.super__Optional_base<int,_true,_true>._M_payload.
                         super__Optional_payload_base<int>,(uint32_t *)&x);
      iVar3 = 2;
      if (!bVar2) {
        MakeUnexpectedEofError();
        iVar3 = 1;
      }
      break;
    default:
switchD_002a4023_default:
      MakeUnknownWireTypeError((json_internal *)this,wire_type);
      goto LAB_002a4287;
    }
LAB_002a425a:
    if (iVar3 != 2) {
LAB_002a4287:
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&group_stack.super__Vector_base<int,_std::allocator<int>_>);
      return (Status)(uintptr_t)this;
    }
  } while( true );
}

Assistant:

absl::Status UntypedMessage::Decode(io::CodedInputStream& stream,
                                    absl::optional<int32_t> current_group) {
  std::vector<int32_t> group_stack;
  while (true) {
    uint32_t tag = stream.ReadTag();
    if (tag == 0) {
      return absl::OkStatus();
    }

    int32_t field_number = tag >> 3;
    int32_t wire_type = tag & 7;

    // EGROUP markers can show up as "unknown fields", so we need to handle them
    // before we even do field lookup. Being inside of a group behaves as if a
    // special field has been added to the message.
    if (wire_type == WireFormatLite::WIRETYPE_END_GROUP &&
        group_stack.empty()) {
      if (!current_group.has_value()) {
        return MakeEndGroupWithoutGroupError(field_number);
      }
      if (field_number != *current_group) {
        return MakeEndGroupMismatchError(field_number, *current_group);
      }
      return absl::OkStatus();
    }

    const auto* field = desc_->FindField(field_number);
    if (!group_stack.empty() || field == nullptr) {
      // Skip unknown field. If the group-stack is non-empty, we are in the
      // process of working through an unknown group.
      switch (wire_type) {
        case WireFormatLite::WIRETYPE_VARINT: {
          uint64_t x;
          if (!stream.ReadVarint64(&x)) {
            return MakeUnexpectedEofError();
          }
          continue;
        }
        case WireFormatLite::WIRETYPE_FIXED64: {
          uint64_t x;
          if (!stream.ReadLittleEndian64(&x)) {
            return MakeUnexpectedEofError();
          }
          continue;
        }
        case WireFormatLite::WIRETYPE_FIXED32: {
          uint32_t x;
          if (!stream.ReadLittleEndian32(&x)) {
            return MakeUnexpectedEofError();
          }
          continue;
        }
        case WireFormatLite::WIRETYPE_LENGTH_DELIMITED: {
          uint32_t x;
          if (!stream.ReadVarint32(&x)) {
            return MakeUnexpectedEofError();
          }
          stream.Skip(x);
          continue;
        }
        case WireFormatLite::WIRETYPE_START_GROUP: {
          group_stack.push_back(field_number);
          continue;
        }
        case WireFormatLite::WIRETYPE_END_GROUP: {
          if (group_stack.empty()) {
            return MakeEndGroupWithoutGroupError(field_number);
          }
          if (field_number != group_stack.back()) {
            return MakeEndGroupMismatchError(field_number, group_stack.back());
          }
          group_stack.pop_back();
          continue;
        }
        default:
          return MakeUnknownWireTypeError(wire_type);
      }
    }
    switch (wire_type) {
      case WireFormatLite::WIRETYPE_VARINT:
        RETURN_IF_ERROR(DecodeVarint(stream, *field));
        break;
      case WireFormatLite::WIRETYPE_FIXED64:
        RETURN_IF_ERROR(Decode64Bit(stream, *field));
        break;
      case WireFormatLite::WIRETYPE_FIXED32:
        RETURN_IF_ERROR(Decode32Bit(stream, *field));
        break;
      case WireFormatLite::WIRETYPE_LENGTH_DELIMITED:
        RETURN_IF_ERROR(DecodeDelimited(stream, *field));
        break;
      case WireFormatLite::WIRETYPE_START_GROUP: {
        if (field->proto().kind() != Field::TYPE_GROUP) {
          return MakeFieldNotGroupError(field->proto().number());
        }
        auto group_desc = field->MessageType();
        RETURN_IF_ERROR(group_desc.status());

        UntypedMessage group(*group_desc);
        RETURN_IF_ERROR(group.Decode(stream, field_number));
        RETURN_IF_ERROR(InsertField(*field, std::move(group)));
        break;
      }
      case WireFormatLite::WIRETYPE_END_GROUP:
        ABSL_LOG(FATAL) << "unreachable";
        break;
      default:
        return MakeUnknownWireTypeError(wire_type);
    }
  }

  return absl::OkStatus();
}